

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen.cpp
# Opt level: O0

void __thiscall ftxui::Screen::Clear(Screen *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  reference this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f0;
  allocator<char> local_b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  iterator local_90;
  size_type local_88;
  Pixel local_80;
  Pixel *local_50;
  Pixel *cell;
  iterator __end2;
  iterator __begin2;
  vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_> *__range2;
  vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_> *line;
  iterator __end1;
  iterator __begin1;
  vector<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>,_std::allocator<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>_>_>
  *__range1;
  Screen *this_local;
  
  __end1 = std::
           vector<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>,_std::allocator<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>_>_>
           ::begin(&this->pixels_);
  line = (vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_> *)
         std::
         vector<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>,_std::allocator<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>_>_>
         ::end(&this->pixels_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>_*,_std::vector<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>,_std::allocator<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>_>_>_>
                                *)&line);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>_*,_std::vector<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>,_std::allocator<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>_>_>_>
              ::operator*(&__end1);
    __end2 = std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>::begin(this_00);
    cell = (Pixel *)std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>::end(this_00);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<ftxui::Pixel_*,_std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>_>
                                  *)&cell);
      if (!bVar1) break;
      local_50 = __gnu_cxx::
                 __normal_iterator<ftxui::Pixel_*,_std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>_>
                 ::operator*(&__end2);
      Pixel::Pixel(&local_80);
      Pixel::operator=(local_50,&local_80);
      Pixel::~Pixel(&local_80);
      __gnu_cxx::
      __normal_iterator<ftxui::Pixel_*,_std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>_>::
      operator++(&__end2);
    }
    __gnu_cxx::
    __normal_iterator<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>_*,_std::vector<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>,_std::allocator<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>_>_>_>
    ::operator++(&__end1);
  }
  (this->cursor_).x = this->dimx_ + -1;
  (this->cursor_).y = this->dimy_ + -1;
  local_b8 = &local_b0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"",&local_b9);
  local_90 = &local_b0;
  local_88 = 1;
  __l._M_len = 1;
  __l._M_array = local_90;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->hyperlinks_,__l);
  local_f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_90;
  do {
    local_f0 = local_f0 + -1;
    std::__cxx11::string::~string((string *)local_f0);
  } while (local_f0 != &local_b0);
  std::allocator<char>::~allocator(&local_b9);
  return;
}

Assistant:

void Screen::Clear() {
  for (auto& line : pixels_) {
    for (auto& cell : line) {
      cell = Pixel();
    }
  }
  cursor_.x = dimx_ - 1;
  cursor_.y = dimy_ - 1;

  hyperlinks_ = {
      "",
  };
}